

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::IfcFaceSurface(IfcFaceSurface *this)

{
  *(undefined ***)&this->field_0x80 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x88 = 0;
  *(char **)&this->field_0x90 = "IfcFaceSurface";
  IfcFace::IfcFace(&this->super_IfcFace,&PTR_construction_vtable_24__007c1ec0);
  *(undefined8 *)&(this->super_IfcFace).field_0x50 = 0;
  *(undefined8 *)&(this->super_IfcFace).field_0x58 = 0;
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7c1e08;
  *(undefined8 *)&this->field_0x80 = 0x7c1ea8;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7c1e30;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7c1e58;
  *(undefined8 *)&(this->super_IfcFace).field_0x48 = 0x7c1e80;
  (this->SameSense)._M_dataplus._M_p = (pointer)&(this->SameSense).field_2;
  (this->SameSense)._M_string_length = 0;
  (this->SameSense).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}